

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url-test.c++
# Opt level: O2

Url * kj::anon_unknown_0::parseAndCheck
                (Url *__return_storage_ptr__,StringPtr originalText,StringPtr expectedRestringified,
                Options options)

{
  bool bVar1;
  int __flags;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  Url *params_00;
  char *__arg;
  undefined6 in_register_0000008a;
  StringPtr url;
  StringPtr expectedRestringified_local;
  StringPtr originalText_local;
  Array<char> local_118;
  Url clone;
  Url *params;
  
  expectedRestringified_local.content.size_ = expectedRestringified.content.size_;
  url.content.ptr = originalText.content.size_;
  originalText_local.content.ptr = originalText.content.ptr;
  expectedRestringified_local.content.ptr = expectedRestringified.content.ptr;
  if (expectedRestringified_local.content.size_ < 2) {
    expectedRestringified_local.content.ptr = originalText_local.content.ptr;
    expectedRestringified_local.content.size_ = url.content.ptr;
  }
  __flags = 0;
  __arg = (char *)(CONCAT62(in_register_0000008a,options) & 0xffffffff);
  url.content.size_ = 0;
  originalText_local.content.size_ = url.content.ptr;
  Url::parse(__return_storage_ptr__,(Url *)originalText_local.content.ptr,url,
             (Context)CONCAT62(in_register_0000008a,options),options);
  str<kj::Url&>(&clone.scheme,(kj *)__return_storage_ptr__,params);
  bVar1 = String::operator==(&clone.scheme,&expectedRestringified_local);
  Array<char>::~Array((Array<char> *)&clone);
  __child_stack = extraout_RDX;
  if (!bVar1 && _::Debug::minSeverity < 3) {
    __arg = "failed: expected kj::str(url) == expectedRestringified";
    __flags = (int)&expectedRestringified_local;
    _::Debug::log<char_const(&)[55],kj::Url&,kj::StringPtr&,kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x21,ERROR,
               "\"failed: expected \" \"kj::str(url) == expectedRestringified\", url, originalText, expectedRestringified"
               ,(char (*) [55])"failed: expected kj::str(url) == expectedRestringified",
               __return_storage_ptr__,&originalText_local,&expectedRestringified_local);
    __child_stack = extraout_RDX_00;
  }
  Url::clone(&clone,(__fn *)__return_storage_ptr__,__child_stack,__flags,__arg);
  str<kj::Url&>((String *)&local_118,(kj *)&clone,params_00);
  bVar1 = String::operator==((String *)&local_118,&expectedRestringified_local);
  Array<char>::~Array(&local_118);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[57],kj::Url&,kj::StringPtr&,kj::StringPtr&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url-test.c++"
               ,0x24,ERROR,
               "\"failed: expected \" \"kj::str(clone) == expectedRestringified\", clone, originalText, expectedRestringified"
               ,(char (*) [57])"failed: expected kj::str(clone) == expectedRestringified",&clone,
               &originalText_local,&expectedRestringified_local);
  }
  Url::~Url(&clone);
  return __return_storage_ptr__;
}

Assistant:

Url parseAndCheck(kj::StringPtr originalText, kj::StringPtr expectedRestringified = nullptr,
                  Url::Options options = {}) {
  if (expectedRestringified == nullptr) expectedRestringified = originalText;
  auto url = Url::parse(originalText, Url::REMOTE_HREF, options);
  KJ_EXPECT(kj::str(url) == expectedRestringified, url, originalText, expectedRestringified);
  // Make sure clones also restringify to the expected string.
  auto clone = url.clone();
  KJ_EXPECT(kj::str(clone) == expectedRestringified, clone, originalText, expectedRestringified);
  return url;
}